

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  byte *pbVar8;
  
  lVar7 = (long)end - (long)ptr;
  if (lVar7 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    bVar6 = 7;
    if (bVar1 - 0xd8 < 4) goto LAB_0040cd21;
    if (bVar1 == 0) {
      bVar6 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      goto LAB_0040cd21;
    }
  }
  else {
    if (bVar1 - 0xdc < 4) {
      bVar6 = 8;
      goto LAB_0040cd21;
    }
    if ((bVar1 == 0xff) && (0xfd < (byte)*ptr)) {
      bVar6 = 0;
      goto LAB_0040cd21;
    }
  }
  bVar6 = 0x1d;
LAB_0040cd21:
  iVar4 = 0;
  pbVar3 = (byte *)ptr;
  iVar5 = iVar4;
  if (bVar6 < 0x16) {
    if (bVar6 == 6) {
      if (lVar7 == 2) {
        return -2;
      }
    }
    else if (bVar6 == 7) {
      if (lVar7 < 4) {
        return -2;
      }
    }
    else {
      iVar5 = 0;
      if (bVar6 == 0x13) {
        pbVar3 = (byte *)(ptr + 2);
        if ((long)end - (long)pbVar3 < 2) {
          return -1;
        }
        if (ptr[3] == '\0') {
          if ((ulong)*pbVar3 == 0x78) {
            pbVar3 = (byte *)(ptr + 4);
            if ((long)end - (long)pbVar3 < 2) {
              return -1;
            }
            iVar5 = iVar4;
            if ((ptr[5] == '\0') &&
               ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar3) & 0xfe) == 0x18)) {
              pbVar3 = (byte *)(ptr + 6);
              lVar7 = (long)end - (long)pbVar3;
              do {
                if (lVar7 < 2) {
                  return -1;
                }
                bVar1 = pbVar3[1];
                if (bVar1 < 0xdc) {
                  bVar6 = 7;
                  if (3 < bVar1 - 0xd8) {
                    if (bVar1 == 0) {
                      bVar6 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar3);
                    }
                    else {
LAB_0040cf6a:
                      bVar6 = 0x1d;
                    }
                  }
                }
                else if (bVar1 - 0xdc < 4) {
                  bVar6 = 8;
                }
                else {
                  if ((bVar1 != 0xff) || (*pbVar3 < 0xfe)) goto LAB_0040cf6a;
                  bVar6 = 0;
                }
                if (1 < bVar6 - 0x18) {
                  if (bVar6 == 0x12) {
                    pbVar3 = pbVar3 + 2;
                    iVar5 = 10;
                  }
                  break;
                }
                pbVar3 = pbVar3 + 2;
                lVar7 = lVar7 + -2;
              } while( true );
            }
          }
          else {
            iVar5 = iVar4;
            if (*(char *)((long)enc[1].scanners + (ulong)*pbVar3) == '\x19') {
              lVar7 = lVar7 + -4;
              do {
                pbVar8 = pbVar3;
                if (lVar7 < 2) {
                  return -1;
                }
                bVar1 = pbVar8[3];
                pbVar3 = pbVar8 + 2;
                if (bVar1 < 0xdc) {
                  cVar2 = '\a';
                  if (3 < bVar1 - 0xd8) {
                    if (bVar1 == 0) {
                      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar3);
                    }
                    else {
LAB_0040d024:
                      cVar2 = '\x1d';
                    }
                  }
                }
                else if (bVar1 - 0xdc < 4) {
                  cVar2 = '\b';
                }
                else {
                  if ((bVar1 != 0xff) || (*pbVar3 < 0xfe)) goto LAB_0040d024;
                  cVar2 = '\0';
                }
                lVar7 = lVar7 + -2;
              } while (cVar2 == '\x19');
              if (cVar2 == '\x12') {
                pbVar3 = pbVar8 + 4;
                iVar5 = 10;
              }
            }
          }
        }
      }
    }
  }
  else if (((bVar6 == 0x16) || (bVar6 == 0x18)) ||
          ((bVar6 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                      ) >> ((byte)*ptr & 0x1f) & 1) != 0)))) {
    pbVar3 = (byte *)(ptr + 2);
    lVar7 = (long)end - (long)pbVar3;
    if (lVar7 < 2) {
      return -1;
    }
    do {
      bVar1 = pbVar3[1];
      if (bVar1 < 0xdc) {
        cVar2 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar3);
          }
          else {
LAB_0040ce34:
            cVar2 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar2 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || (*pbVar3 < 0xfe)) goto LAB_0040ce34;
        cVar2 = '\0';
      }
      switch(cVar2) {
      case '\x12':
        pbVar3 = pbVar3 + 2;
        iVar5 = 9;
      case '\x13':
      case '\x14':
      case '\x15':
      case '\x17':
      case '\x1c':
        goto switchD_0040ce4c_caseD_13;
      case '\x1d':
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(*pbVar3 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5
                             )) >> (*pbVar3 & 0x1f) & 1) == 0) goto switchD_0040ce4c_caseD_13;
      case '\x16':
      case '\x18':
      case '\x19':
      case '\x1a':
      case '\x1b':
        pbVar3 = pbVar3 + 2;
        lVar7 = lVar7 + -2;
        if (lVar7 < 2) {
          return -1;
        }
        break;
      default:
        if (cVar2 == '\x06') {
          if (lVar7 == 2) {
            return -2;
          }
        }
        else if ((cVar2 == '\a') && (lVar7 < 4)) {
          return -2;
        }
        goto switchD_0040ce4c_caseD_13;
      }
    } while( true );
  }
switchD_0040ce4c_caseD_13:
  *nextTokPtr = (char *)pbVar3;
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}